

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * build_gnu_sparse_name(char *dest,char *src)

{
  size_t sVar1;
  char *local_70;
  char *p;
  char buff [64];
  char *src_local;
  char *dest_local;
  
  if ((src == (char *)0x0) || (*src == '\0')) {
    strcpy(dest,"GNUSparseFile/blank");
  }
  else {
    sVar1 = strlen(src);
    local_70 = src + sVar1;
    while( true ) {
      for (; (src < local_70 && (local_70[-1] == '/')); local_70 = local_70 + -1) {
      }
      if ((local_70 <= src + 1) || ((local_70[-1] != '.' || (local_70[-2] != '/')))) break;
      local_70 = local_70 + -1;
    }
    strcpy((char *)&p,"GNUSparseFile");
    build_ustar_entry_name(dest,src,(long)local_70 - (long)src,(char *)&p);
  }
  return dest;
}

Assistant:

static char *
build_gnu_sparse_name(char *dest, const char *src)
{
	char buff[64];
	const char *p;

	/* Handle the null filename case. */
	if (src == NULL || *src == '\0') {
		strcpy(dest, "GNUSparseFile/blank");
		return (dest);
	}

	/* Prune final '/' and other unwanted final elements. */
	p = src + strlen(src);
	for (;;) {
		/* Ends in "/", remove the '/' */
		if (p > src && p[-1] == '/') {
			--p;
			continue;
		}
		/* Ends in "/.", remove the '.' */
		if (p > src + 1 && p[-1] == '.'
		    && p[-2] == '/') {
			--p;
			continue;
		}
		break;
	}

#if HAVE_GETPID && 0  /* Disable this as pax attribute name. */
	sprintf(buff, "GNUSparseFile.%d", getpid());
#else
	/* If the platform can't fetch the pid, don't include it. */
	strcpy(buff, "GNUSparseFile");
#endif
	/* General case: build a ustar-compatible name adding
	 * "/GNUSparseFile/". */
	build_ustar_entry_name(dest, src, p - src, buff);

	return (dest);
}